

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

int * getBiomeParaLimits(int mc,int id)

{
  int i;
  int id_local;
  int mc_local;
  
  if (0x15 < mc) {
    if (0x1b < mc) {
      i = 0;
      while (g_biome_para_range_21wd_diff[i][0] != -1) {
        if (g_biome_para_range_21wd_diff[i][0] == id) {
          return g_biome_para_range_21wd_diff[i] + 1;
        }
        i = i + 1;
      }
    }
    if (0x18 < mc) {
      i = 0;
      while (g_biome_para_range_20_diff[i][0] != -1) {
        if (g_biome_para_range_20_diff[i][0] == id) {
          return g_biome_para_range_20_diff[i] + 1;
        }
        i = i + 1;
      }
    }
    if (0x16 < mc) {
      i = 0;
      while (g_biome_para_range_19_diff[i][0] != -1) {
        if (g_biome_para_range_19_diff[i][0] == id) {
          return g_biome_para_range_19_diff[i] + 1;
        }
        i = i + 1;
      }
    }
    i = 0;
    while (g_biome_para_range_18[i][0] != -1) {
      if (g_biome_para_range_18[i][0] == id) {
        return g_biome_para_range_18[i] + 1;
      }
      i = i + 1;
    }
  }
  return (int *)0x0;
}

Assistant:

const int *getBiomeParaLimits(int mc, int id)
{
    if (mc <= MC_1_17)
        return NULL;
    int i;
    if (mc > MC_1_21_3)
    {
        for (i = 0; g_biome_para_range_21wd_diff[i][0] != -1; i++)
        {
            if (g_biome_para_range_21wd_diff[i][0] == id)
                return &g_biome_para_range_21wd_diff[i][1];
        }
    }
    if (mc > MC_1_19)
    {
        for (i = 0; g_biome_para_range_20_diff[i][0] != -1; i++)
        {
            if (g_biome_para_range_20_diff[i][0] == id)
                return &g_biome_para_range_20_diff[i][1];
        }
    }
    if (mc > MC_1_18)
    {
        for (i = 0; g_biome_para_range_19_diff[i][0] != -1; i++)
        {
            if (g_biome_para_range_19_diff[i][0] == id)
                return &g_biome_para_range_19_diff[i][1];
        }
    }
    for (i = 0; g_biome_para_range_18[i][0] != -1; i++)
    {
        if (g_biome_para_range_18[i][0] == id)
            return &g_biome_para_range_18[i][1];
    }
    return NULL;
}